

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O2

int ndn_name_tlv_encode(ndn_encoder_t *encoder,ndn_name_t *name)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint32_t var;
  ndn_name_t *component;
  uint uVar4;
  ulong uVar5;
  
  iVar2 = encoder_append_var(encoder,7);
  if (iVar2 == 0) {
    var = 0;
    for (lVar3 = 0; (ulong)name->components_size * 0x2c - lVar3 != 0; lVar3 = lVar3 + 0x2c) {
      uVar1 = *(uint *)(name->components[0].value + lVar3 + -4);
      uVar4 = (uint)name->components[0].value[lVar3 + 0x24];
      iVar2 = (0xffff < uVar1) + 3 + (uint)(0xffff < uVar1);
      if (uVar1 < 0xfd) {
        iVar2 = 1;
      }
      var = var + uVar4 + iVar2 + (uint)(0xfc < uVar4) * 2 + 1;
    }
    iVar2 = encoder_append_var(encoder,var);
    if (iVar2 == 0) {
      uVar5 = 0xffffffffffffffff;
      component = name;
      do {
        uVar5 = uVar5 + 1;
        if (name->components_size <= uVar5) {
          return 0;
        }
        iVar2 = name_component_tlv_encode(encoder,component->components);
        component = (ndn_name_t *)(component->components + 1);
      } while (-1 < iVar2);
    }
  }
  return iVar2;
}

Assistant:

int
ndn_name_tlv_encode(ndn_encoder_t* encoder, const ndn_name_t *name)
{
  int ret_val = -1;
  int block_sizes[name->components_size];
  ret_val = encoder_append_type(encoder, TLV_Name);
  if (ret_val != NDN_SUCCESS) return ret_val;
  size_t value_size = 0;
  for (size_t i = 0; i < name->components_size; i++) {
    block_sizes[i] = name_component_probe_block_size(&name->components[i]);
    value_size += block_sizes[i];
  }
  ret_val = encoder_append_length(encoder, value_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  for (size_t i = 0; i < name->components_size; i++) {
    int result = name_component_tlv_encode(encoder, &name->components[i]);
    if (result < 0)
      return result;
  }
  return 0;
}